

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O2

int Pla_CubeHashValue(Vec_Int_t *vCube)

{
  int iVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < vCube->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vCube,i);
    iVar1 = Pla_HashValue(iVar1);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

static inline int Pla_CubeHashValue( Vec_Int_t * vCube )
{
    int i, Lit, Value = 0;
    Vec_IntForEachEntry( vCube, Lit, i )
        Value += Pla_HashValue(Lit);
    return Value;
}